

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::DoubleParameter::clear_AllowedValues(DoubleParameter *this)

{
  AllowedValuesCase AVar1;
  DoubleParameter *this_local;
  
  AVar1 = AllowedValues_case(this);
  if (((AVar1 != ALLOWEDVALUES_NOT_SET) && (AVar1 == kRange)) &&
     ((this->AllowedValues_).range_ != (DoubleRange *)0x0)) {
    (*(((this->AllowedValues_).range_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void DoubleParameter::clear_AllowedValues() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.DoubleParameter)
  switch (AllowedValues_case()) {
    case kRange: {
      delete AllowedValues_.range_;
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = ALLOWEDVALUES_NOT_SET;
}